

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void auto_commit_test(void)

{
  fdb_kvs_handle *pfVar1;
  void *pvVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t valuelen;
  void *value_out;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_config fconfig;
  fdb_kvs_handle *local_370;
  fdb_file_handle *local_368;
  size_t local_360;
  void *local_358;
  fdb_kvs_config local_350;
  timeval local_338;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x1000;
  local_128.flags = 1;
  local_128.durability_opt = '\x02';
  local_128.auto_commit = true;
  fVar3 = fdb_open(&local_368,"dummy1",&local_128);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xed2);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xed2,"void auto_commit_test()");
  }
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xed4);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xed4,"void auto_commit_test()");
  }
  uVar7 = 0;
  while (uVar7 != 5000) {
    sprintf(local_228,"key%d",(ulong)uVar7);
    sprintf(local_328,"body%d",(ulong)uVar7);
    pfVar1 = local_370;
    sVar5 = strlen(local_228);
    sVar6 = strlen(local_328);
    fVar3 = fdb_set_kv(pfVar1,local_228,sVar5 + 1,local_328,sVar6 + 1);
    uVar7 = uVar7 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xedb);
      auto_commit_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xedb,"void auto_commit_test()");
    }
  }
  for (uVar7 = 0; uVar7 != 5000; uVar7 = uVar7 + 1) {
    sprintf(local_228,"key%d",(ulong)uVar7);
    sprintf(local_328,"body%d",(ulong)uVar7);
    pfVar1 = local_370;
    sVar5 = strlen(local_228);
    fVar3 = fdb_get_kv(pfVar1,local_228,sVar5 + 1,&local_358,&local_360);
    pvVar2 = local_358;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xee3);
      auto_commit_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xee3,"void auto_commit_test()");
    }
    iVar4 = bcmp(local_358,local_328,local_360);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_328,pvVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xee4);
      auto_commit_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xee4,"void auto_commit_test()");
    }
    fdb_free_block(pvVar2);
  }
  fVar3 = fdb_kvs_close(local_370);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xee9);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xee9,"void auto_commit_test()");
  }
  fVar3 = fdb_close(local_368);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xeec);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xeec,"void auto_commit_test()");
  }
  fVar3 = fdb_open(&local_368,"dummy1",&local_128);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xeee);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xeee,"void auto_commit_test()");
  }
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uVar7 = 0;
    while( true ) {
      if (uVar7 == 5000) {
        fVar3 = fdb_close(local_368);
        if (fVar3 == FDB_RESULT_SUCCESS) {
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (auto_commit_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"auto commit test");
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xefe);
        auto_commit_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xefe,"void auto_commit_test()");
      }
      sprintf(local_228,"key%d",(ulong)uVar7);
      sprintf(local_328,"body%d",(ulong)uVar7);
      pfVar1 = local_370;
      sVar5 = strlen(local_228);
      fVar3 = fdb_get_kv(pfVar1,local_228,sVar5 + 1,&local_358,&local_360);
      pvVar2 = local_358;
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      iVar4 = bcmp(local_358,local_328,local_360);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_328,pvVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xef8);
        auto_commit_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xef8,"void auto_commit_test()");
      }
      fdb_free_block(pvVar2);
      uVar7 = uVar7 + 1;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xef7);
    auto_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xef7,"void auto_commit_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xef0);
  auto_commit_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xef0,"void auto_commit_test()");
}

Assistant:

void auto_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char key[256], value[256];
    void *value_out;
    size_t valuelen;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.auto_commit = true;

    // open db
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // retrieve check before close
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close & reopen
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve check again
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    // free all resources
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto commit test");
}